

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_CCtx_init_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_dictContentType_e dictContentType;
  void *dict;
  void *dict_00;
  ZSTD_customMem customMem;
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_CDict *pZVar3;
  size_t sVar4;
  ZSTD_paramSwitch_e ZVar5;
  size_t sVar6;
  ZSTD_cParamMode_e mode;
  U64 pledgedSrcSize;
  U64 srcSizeHint;
  ZSTD_CCtx_params local_128;
  ZSTD_compressionParameters local_4c;
  
  switchD_012b9b0d::default(&local_128,&cctx->requestedParams,0xd8);
  dict = (cctx->localDict).dict;
  dict_00 = (cctx->prefixDict).dict;
  sVar4 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  if ((dict != (void *)0x0) && ((cctx->localDict).cdict == (ZSTD_CDict *)0x0)) {
    customMem.opaque._4_4_ = (int)((ulong)(cctx->customMem).opaque >> 0x20);
    customMem._0_20_ = *(undefined1 (*) [20])&cctx->customMem;
    pZVar3 = ZSTD_createCDict_advanced2
                       (dict,(cctx->localDict).dictSize,ZSTD_dlm_byRef,
                        (cctx->localDict).dictContentType,&cctx->requestedParams,customMem);
    (cctx->localDict).cdict = pZVar3;
    if (pZVar3 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
    cctx->cdict = pZVar3;
  }
  (cctx->prefixDict).dict = (void *)0x0;
  (cctx->prefixDict).dictSize = 0;
  *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
  pZVar3 = cctx->cdict;
  if ((pZVar3 != (ZSTD_CDict *)0x0) && ((cctx->localDict).cdict == (ZSTD_CDict *)0x0)) {
    local_128.compressionLevel = pZVar3->compressionLevel;
  }
  if (endOp == ZSTD_e_end) {
    cctx->pledgedSrcSizePlusOne = inSize + 1;
  }
  if (dict_00 == (void *)0x0) {
    if (pZVar3 != (ZSTD_CDict *)0x0) {
      srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
      sVar6 = pZVar3->dictContentSize;
      goto LAB_018b264a;
    }
    srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
    sVar6 = 0;
  }
  else {
    srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
    sVar6 = sVar4;
    if (pZVar3 != (ZSTD_CDict *)0x0) {
LAB_018b264a:
      mode = ZSTD_cpm_attachDict;
      if ((pZVar3->matchState).dedicatedDictSearch != 0) goto LAB_018b26b5;
      if ((srcSizeHint == 0xffffffffffffffff) ||
         (srcSizeHint <=
          *(ulong *)(attachDictSizeCutoffs + (ulong)(pZVar3->matchState).cParams.strategy * 8))) {
        if (local_128.attachDictPref != ZSTD_dictForceCopy && local_128.forceWindow == 0)
        goto LAB_018b26b5;
      }
      else if (local_128.attachDictPref == ZSTD_dictForceAttach && local_128.forceWindow == 0)
      goto LAB_018b26b5;
    }
  }
  mode = ZSTD_cpm_noAttachDict;
LAB_018b26b5:
  ZSTD_getCParamsFromCCtxParams(&local_4c,&local_128,srcSizeHint,sVar6,mode);
  local_128.cParams.targetLength = local_4c.targetLength;
  local_128.cParams.strategy = local_4c.strategy;
  uVar2 = local_128.cParams._20_8_;
  local_128.cParams.windowLog = local_4c.windowLog;
  local_128.cParams.chainLog = local_4c.chainLog;
  uVar1 = local_128.cParams._0_8_;
  local_128.cParams.strategy = local_4c.strategy;
  local_128.cParams.windowLog = local_4c.windowLog;
  if ((local_128.useBlockSplitter == ZSTD_ps_auto) &&
     (local_128.useBlockSplitter = ZSTD_ps_disable, 6 < (int)local_128.cParams.strategy)) {
    local_128.useBlockSplitter = (local_128.cParams.windowLog < 0x11) + ZSTD_ps_enable;
  }
  if ((local_128.ldmParams.enableLdm == ZSTD_ps_auto) &&
     (local_128.ldmParams.enableLdm = ZSTD_ps_disable, 6 < (int)local_128.cParams.strategy)) {
    local_128.ldmParams.enableLdm = (local_128.cParams.windowLog < 0x1b) + ZSTD_ps_enable;
  }
  if ((local_128.useRowMatchFinder == ZSTD_ps_auto) &&
     (local_128.useRowMatchFinder = ZSTD_ps_disable,
     0xfffffffc < local_128.cParams.strategy - ZSTD_btlazy2)) {
    local_128.useRowMatchFinder = (local_128.cParams.windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar6 = 0x20000;
  if (local_128.maxBlockSize != 0) {
    sVar6 = local_128.maxBlockSize;
  }
  ZVar5 = (local_128.compressionLevel < 10) + ZSTD_ps_enable;
  if (local_128.searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar5 = local_128.searchForExternalRepcodes;
  }
  local_128.cParams._0_8_ = uVar1;
  local_128.cParams._20_8_ = uVar2;
  local_128.maxBlockSize = sVar6;
  local_128.searchForExternalRepcodes = ZVar5;
  sVar4 = ZSTD_compressBegin_internal
                    (cctx,dict_00,sVar4,dictContentType,ZSTD_dtlm_fast,pZVar3,&local_128,srcSizeHint
                     ,ZSTDb_buffered);
  if (sVar4 < 0xffffffffffffff89) {
    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      sVar4 = (ulong)(cctx->blockSize == srcSizeHint) + cctx->blockSize;
    }
    else {
      sVar4 = 0;
    }
    cctx->inBuffTarget = sVar4;
    cctx->outBuffContentSize = 0;
    cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        ZSTD_hasExtSeqProd(&params) && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}